

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

MethodOptions *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::MethodOptions>(Arena *arena)

{
  MethodOptions *this;
  
  if (arena == (Arena *)0x0) {
    this = (MethodOptions *)operator_new(0x50);
    MethodOptions::MethodOptions(this,(Arena *)0x0);
  }
  else {
    if (arena->hooks_cookie_ != (void *)0x0) {
      OnArenaAllocation(arena,(type_info *)&MethodOptions::typeinfo,0x50);
    }
    this = (MethodOptions *)AllocateAlignedNoHook(arena,0x50);
    MethodOptions::MethodOptions(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::MethodOptions* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::MethodOptions >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::MethodOptions >(arena);
}